

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall Assimp::SMDImporter::FixTimeValues(SMDImporter *this)

{
  int iVar1;
  bool bVar2;
  reference pBVar3;
  reference pMVar4;
  double *pdVar5;
  __normal_iterator<Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
  local_40;
  __normal_iterator<Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
  local_38;
  iterator iKey;
  __normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
  local_28;
  iterator iBone;
  double dMax;
  double dDelta;
  SMDImporter *this_local;
  
  iVar1 = this->iSmallestFrame;
  iBone._M_current = (Bone *)0x0;
  local_28._M_current =
       (Bone *)std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::begin
                         (&this->asBones);
  while( true ) {
    iKey._M_current =
         (MatrixKey *)
         std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>::end(&this->asBones);
    bVar2 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
                        *)&iKey);
    if (!bVar2) break;
    pBVar3 = __gnu_cxx::
             __normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
             ::operator*(&local_28);
    local_38._M_current =
         (MatrixKey *)
         std::
         vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
         ::begin(&(pBVar3->sAnim).asKeys);
    while( true ) {
      pBVar3 = __gnu_cxx::
               __normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
               ::operator*(&local_28);
      local_40._M_current =
           (MatrixKey *)
           std::
           vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
           ::end(&(pBVar3->sAnim).asKeys);
      bVar2 = __gnu_cxx::operator!=(&local_38,&local_40);
      if (!bVar2) break;
      pMVar4 = __gnu_cxx::
               __normal_iterator<Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
               ::operator*(&local_38);
      pMVar4->dTime = pMVar4->dTime - (double)iVar1;
      pMVar4 = __gnu_cxx::
               __normal_iterator<Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
               ::operator*(&local_38);
      pdVar5 = std::max<double>((double *)&iBone,&pMVar4->dTime);
      iBone._M_current = (Bone *)*pdVar5;
      __gnu_cxx::
      __normal_iterator<Assimp::SMD::Bone::Animation::MatrixKey_*,_std::vector<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>_>
      ::operator++(&local_38);
    }
    __gnu_cxx::
    __normal_iterator<Assimp::SMD::Bone_*,_std::vector<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>_>
    ::operator++(&local_28);
  }
  this->dLengthOfAnim = (double)iBone._M_current;
  return;
}

Assistant:

void SMDImporter::FixTimeValues() {
    double dDelta = (double)iSmallestFrame;
    double dMax = 0.0f;
    for (std::vector<SMD::Bone>::iterator
            iBone =  asBones.begin();
            iBone != asBones.end();++iBone) {
        for (std::vector<SMD::Bone::Animation::MatrixKey>::iterator
                iKey =  (*iBone).sAnim.asKeys.begin();
                iKey != (*iBone).sAnim.asKeys.end();++iKey) {
            (*iKey).dTime -= dDelta;
            dMax = std::max(dMax, (*iKey).dTime);
        }
    }
    dLengthOfAnim = dMax;
}